

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O3

string * GDSkey2ASCII_abi_cxx11_(string *__return_storage_ptr__,uint inHex)

{
  undefined8 in_RAX;
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_ == '\0') {
    GDSkey2ASCII_abi_cxx11_();
  }
  if (GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_ == '\0') {
    GDSkey2ASCII_abi_cxx11_();
  }
  if (GDSkey2ASCII[abi:cxx11](unsigned_int)::readInYet == '\0') {
    GDSkey2ASCII[abi:cxx11](unsigned_int)::readInYet = '\x01';
    uStack_28 = CONCAT44(2,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117901);
    uStack_28 = CONCAT44(0x102,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117908);
    uStack_28 = CONCAT44(0x206,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11790f);
    uStack_28 = CONCAT44(0x305,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117917);
    uStack_28 = CONCAT44(0x400,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11791d);
    uStack_28 = CONCAT44(0x502,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117924);
    uStack_28 = CONCAT44(0x606,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11792b);
    uStack_28 = CONCAT44(0x700,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117933);
    uStack_28 = CONCAT44(0x800,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11793a);
    uStack_28 = CONCAT44(0x900,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117943);
    uStack_28 = CONCAT44(0xa00,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117948);
    uStack_28 = CONCAT44(0xb00,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11794d);
    uStack_28 = CONCAT44(0xc00,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117952);
    uStack_28 = CONCAT44(0xd02,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117957);
    uStack_28 = CONCAT44(0xe02,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11795d);
    uStack_28 = CONCAT44(0xf03,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117966);
    uStack_28 = CONCAT44(0x1003,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11796c);
    uStack_28 = CONCAT44(0x1100,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11796f);
    uStack_28 = CONCAT44(0x1206,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117975);
    uStack_28 = CONCAT44(0x1302,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11797b);
    uStack_28 = CONCAT44(0x1500,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117982);
    uStack_28 = CONCAT44(0x1602,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117987);
    uStack_28 = CONCAT44(0x1701,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117990);
    uStack_28 = CONCAT44(0x1906,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x11799d);
    uStack_28 = CONCAT44(0x1a01,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179a4);
    uStack_28 = CONCAT44(0x1b05,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179ab);
    uStack_28 = CONCAT44(0x1c05,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179af);
    uStack_28 = CONCAT44(0x1f06,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179b5);
    uStack_28 = CONCAT44(0x2006,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179bd);
    uStack_28 = CONCAT44(0x2102,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179c3);
    uStack_28 = CONCAT44(0x2202,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179cc);
    uStack_28 = CONCAT44(0x2306,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179d8);
    uStack_28 = CONCAT44(0x2601,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179e2);
    uStack_28 = CONCAT44(0x2a02,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179e9);
    uStack_28 = CONCAT44(0x2b02,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179f2);
    uStack_28 = CONCAT44(0x2c06,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x1179fb);
    uStack_28 = CONCAT44(0x2d00,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117a05);
    uStack_28 = CONCAT44(0x2e02,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117a09);
    uStack_28 = CONCAT44(0x2f03,(undefined4)uStack_28);
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,
                          (key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,0x117a15);
  }
  if (GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_._M_t._M_impl.
              super__Rb_tree_header._M_header;
    p_Var3 = GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_._M_t._M_impl.
             super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)inHex <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < (int)inHex];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 !=
         &GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_._M_t._M_impl.
          super__Rb_tree_header) && ((int)p_Var2[1]._M_color <= (int)inHex)) {
      GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_._M_node = p_Var2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,p_Var2[1]._M_parent,
                 (long)&(p_Var2[1]._M_parent)->_M_color + (long)&(p_Var2[1]._M_left)->_M_color);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string GDSkey2ASCII(unsigned int inHex)
{
  static map<int, string> GDSkeys;
  static map<int, string>::iterator it;

  static bool readInYet = false;

  if (!readInYet) {
    readInYet = true;
    GDSkeys[0x0002] = "HEADER";
    GDSkeys[0x0102] = "BGNLIB";
    GDSkeys[0x0206] = "LIBNAME";
    GDSkeys[0x0305] = "UNITS";
    GDSkeys[0x0400] = "ENDLIB";
    GDSkeys[0x0502] = "BGNSTR";
    GDSkeys[0x0606] = "STRNAME";
    GDSkeys[0x0700] = "ENDSTR";
    GDSkeys[0x0800] = "BOUNDARY";
    GDSkeys[0x0900] = "PATH";
    GDSkeys[0x0a00] = "SREF";
    GDSkeys[0x0b00] = "AREF";
    GDSkeys[0x0c00] = "TEXT";
    GDSkeys[0x0d02] = "LAYER";
    GDSkeys[0x0e02] = "DATATYPE";
    GDSkeys[0x0f03] = "WIDTH";
    GDSkeys[0x1003] = "XY";
    GDSkeys[0x1100] = "ENDEL";
    GDSkeys[0x1206] = "SNAME";
    GDSkeys[0x1302] = "COLROW";
    GDSkeys[0x1500] = "NODE";
    GDSkeys[0x1602] = "TEXTTYPE";
    GDSkeys[0x1701] = "PRESENTATION";
    GDSkeys[0x1906] = "STRING";
    GDSkeys[0x1a01] = "STRANS";
    GDSkeys[0x1b05] = "MAG";
    GDSkeys[0x1c05] = "ANGLE";
    GDSkeys[0x1f06] = "REFLIBS";
    GDSkeys[0x2006] = "FONTS";
    GDSkeys[0x2102] = "PATHTYPE";
    GDSkeys[0x2202] = "GENERATIONS";
    GDSkeys[0x2306] = "ATTRTABLE";
    GDSkeys[0x2601] = "EFLAGS";
    GDSkeys[0x2a02] = "NODETYPE";
    GDSkeys[0x2b02] = "PROPATTR";
    GDSkeys[0x2c06] = "PROPVALUE";
    GDSkeys[0x2d00] = "BOX";
    GDSkeys[0x2e02] = "GDS_BOXTYPE";
    GDSkeys[0x2f03] = "PLEX";
  }

  it = GDSkeys.find(inHex);

  if (it == GDSkeys.end())
    return "\0";

  return it->second;
}